

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts5HashScanEntry
               (Fts5Hash *pHash,char **pzTerm,int *pnTerm,u8 **ppDoclist,int *pnDoclist)

{
  Fts5HashEntry *p;
  u8 *puVar1;
  int iVar2;
  Fts5HashEntry *pFVar3;
  
  p = pHash->pScan;
  if (p == (Fts5HashEntry *)0x0) {
    *pnTerm = 0;
    pFVar3 = (Fts5HashEntry *)0x0;
    puVar1 = (u8 *)0x0;
    iVar2 = 0;
  }
  else {
    pFVar3 = p + 1;
    iVar2 = p->nKey;
    fts5HashAddPoslistSize(pHash,p,(Fts5HashEntry *)0x0);
    *pnTerm = iVar2;
    puVar1 = (u8 *)((long)&p[1].pHashNext + (long)iVar2);
    iVar2 = (p->nData - iVar2) + -0x30;
  }
  *pzTerm = (char *)pFVar3;
  *ppDoclist = puVar1;
  *pnDoclist = iVar2;
  return;
}

Assistant:

static void sqlite3Fts5HashScanEntry(
  Fts5Hash *pHash,
  const char **pzTerm,            /* OUT: term (nul-terminated) */
  int *pnTerm,                    /* OUT: Size of term in bytes */
  const u8 **ppDoclist,           /* OUT: pointer to doclist */
  int *pnDoclist                  /* OUT: size of doclist in bytes */
){
  Fts5HashEntry *p;
  if( (p = pHash->pScan) ){
    char *zKey = fts5EntryKey(p);
    int nTerm = p->nKey;
    fts5HashAddPoslistSize(pHash, p, 0);
    *pzTerm = zKey;
    *pnTerm = nTerm;
    *ppDoclist = (const u8*)&zKey[nTerm];
    *pnDoclist = p->nData - (sizeof(Fts5HashEntry) + nTerm);
  }else{
    *pzTerm = 0;
    *pnTerm = 0;
    *ppDoclist = 0;
    *pnDoclist = 0;
  }
}